

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_get_format_values(bcf_hdr_t *hdr,bcf1_t *line,char *tag,void **dst,int *ndst,int type)

{
  uint *puVar1;
  undefined8 *puVar2;
  uint8_t uVar3;
  short sVar4;
  uint32_t uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint uVar15;
  void *pvVar16;
  uint8_t *puVar17;
  void *pvVar18;
  char cVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  undefined4 *puVar23;
  uint32_t *puVar24;
  int iVar25;
  uint uVar26;
  bcf_fmt_t *pbVar27;
  size_t sVar28;
  uint32_t uVar29;
  ulong uVar30;
  uint *puVar31;
  char *pcVar32;
  long lVar33;
  int iVar34;
  char *pcVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  anon_union_4_2_947300a4 u;
  int iVar43;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  
  uVar15 = bcf_hdr_id2int(hdr,0,tag);
  sVar28 = 0xffffffff;
  if ((-1 < (int)uVar15) && (uVar42 = (hdr->id[0][uVar15].val)->info[2], (~uVar42 & 0xf) != 0)) {
    if ((*tag == 'G') && ((tag[1] == 'T' && (tag[2] == '\0')))) {
      sVar28 = 0xfffffffe;
      if ((uVar42 & 0xf0) != 0x30) goto LAB_00121446;
    }
    else {
      sVar28 = 0xfffffffe;
      if ((uVar42 >> 4 & 0xf) != type) goto LAB_00121446;
    }
    if ((line->unpacked & 8) == 0) {
      bcf_unpack(line,8);
    }
    uVar41 = *(ulong *)&line->field_0x10;
    if ((uVar41 & 0xff00000000) != 0) {
      pbVar27 = (line->d).fmt;
      uVar22 = 0;
      do {
        if (pbVar27->id == uVar15) goto LAB_0012114a;
        uVar22 = uVar22 + 1;
        pbVar27 = pbVar27 + 1;
      } while ((uVar41 >> 0x20 & 0xff) != uVar22);
      sVar28 = 0xfffffffd;
      goto LAB_00121446;
    }
    uVar22 = 0;
LAB_0012114a:
    sVar28 = 0xfffffffd;
    if ((uint)uVar22 == ((uint)(uVar41 >> 0x20) & 0xff)) goto LAB_00121446;
    uVar22 = uVar22 & 0xffffffff;
    pbVar27 = (line->d).fmt;
    if (type == 3) {
      sVar28 = (long)hdr->n[2] * (long)pbVar27[uVar22].n;
      pvVar16 = *dst;
      if (*ndst < (int)sVar28) {
        pvVar16 = realloc(pvVar16,sVar28);
        *dst = pvVar16;
        if (pvVar16 == (void *)0x0) {
          sVar28 = 0xfffffffc;
          goto LAB_00121446;
        }
        *ndst = (int)sVar28;
      }
      memcpy(pvVar16,pbVar27[uVar22].p,sVar28);
      goto LAB_00121446;
    }
    iVar43 = hdr->n[2];
    sVar28 = (long)pbVar27[uVar22].n * (long)iVar43;
    if (*ndst < (int)sVar28) {
      *ndst = (int)sVar28;
      sVar28 = sVar28 * 4;
      pvVar16 = realloc(*dst,sVar28);
      *dst = pvVar16;
    }
    uVar13 = bcf_float_vector_end;
    uVar12 = bcf_float_missing;
    iVar25 = (int)sVar28;
    puVar31 = (uint *)(ulong)(uint)pbVar27[uVar22].type;
    switch(pbVar27[uVar22].type) {
    case 1:
      uVar15 = pbVar27[uVar22].n;
      uVar41 = (ulong)uVar15;
      if (0 < iVar43) {
        puVar17 = pbVar27[uVar22].p;
        puVar23 = (undefined4 *)*dst;
        iVar25 = 0;
        do {
          if ((int)uVar41 < 1) {
            uVar30 = 0;
          }
          else {
            lVar38 = 0;
            uVar30 = 0;
            do {
              uVar3 = puVar17[uVar30];
              iVar34 = -0x80000000;
              if (uVar3 != 0x80) {
                if (uVar3 == 0x81) {
                  puVar23[uVar30] = 0x80000001;
                  uVar41 = (ulong)(uint)pbVar27[uVar22].n;
                  break;
                }
                iVar34 = (int)(char)uVar3;
              }
              puVar23[uVar30] = iVar34;
              uVar30 = uVar30 + 1;
              uVar41 = (ulong)pbVar27[uVar22].n;
              lVar38 = lVar38 + 4;
            } while ((long)uVar30 < (long)uVar41);
            puVar23 = (undefined4 *)((long)puVar23 + lVar38);
          }
          while( true ) {
            uVar15 = (uint)uVar41;
            if ((int)uVar15 <= (int)uVar30) break;
            *puVar23 = 0x80000001;
            puVar23 = puVar23 + 1;
            uVar30 = (ulong)((int)uVar30 + 1);
            uVar41 = (ulong)(uint)pbVar27[uVar22].n;
          }
          puVar17 = puVar17 + pbVar27[uVar22].size;
          iVar25 = iVar25 + 1;
        } while (iVar25 != iVar43);
      }
      break;
    case 2:
      uVar15 = pbVar27[uVar22].n;
      uVar41 = (ulong)uVar15;
      if (0 < iVar43) {
        puVar17 = pbVar27[uVar22].p;
        puVar23 = (undefined4 *)*dst;
        iVar25 = 0;
        do {
          if ((int)uVar41 < 1) {
            uVar30 = 0;
          }
          else {
            lVar38 = 0;
            uVar30 = 0;
            do {
              sVar4 = *(short *)(puVar17 + uVar30 * 2);
              iVar34 = -0x80000000;
              if (sVar4 != -0x8000) {
                if (sVar4 == -0x7fff) {
                  puVar23[uVar30] = 0x80000001;
                  uVar41 = (ulong)(uint)pbVar27[uVar22].n;
                  break;
                }
                iVar34 = (int)sVar4;
              }
              puVar23[uVar30] = iVar34;
              uVar30 = uVar30 + 1;
              uVar41 = (ulong)pbVar27[uVar22].n;
              lVar38 = lVar38 + 4;
            } while ((long)uVar30 < (long)uVar41);
            puVar23 = (undefined4 *)((long)puVar23 + lVar38);
          }
          while( true ) {
            uVar15 = (uint)uVar41;
            if ((int)uVar15 <= (int)uVar30) break;
            *puVar23 = 0x80000001;
            puVar23 = puVar23 + 1;
            uVar30 = (ulong)((int)uVar30 + 1);
            uVar41 = (ulong)(uint)pbVar27[uVar22].n;
          }
          puVar17 = puVar17 + pbVar27[uVar22].size;
          iVar25 = iVar25 + 1;
        } while (iVar25 != iVar43);
      }
      break;
    case 3:
      uVar15 = pbVar27[uVar22].n;
      uVar41 = (ulong)uVar15;
      if (0 < iVar43) {
        puVar17 = pbVar27[uVar22].p;
        puVar23 = (undefined4 *)*dst;
        iVar25 = 0;
        do {
          if ((int)uVar41 < 1) {
            uVar30 = 0;
          }
          else {
            lVar38 = 0;
            uVar30 = 0;
            do {
              if (*(int *)(puVar17 + uVar30 * 4) == -0x7fffffff) {
                puVar23[uVar30] = 0x80000001;
                uVar41 = (ulong)(uint)pbVar27[uVar22].n;
                break;
              }
              puVar23[uVar30] = *(int *)(puVar17 + uVar30 * 4);
              uVar30 = uVar30 + 1;
              uVar41 = (ulong)pbVar27[uVar22].n;
              lVar38 = lVar38 + 4;
            } while ((long)uVar30 < (long)uVar41);
            puVar23 = (undefined4 *)((long)puVar23 + lVar38);
          }
          while( true ) {
            uVar15 = (uint)uVar41;
            if ((int)uVar15 <= (int)uVar30) break;
            *puVar23 = 0x80000001;
            puVar23 = puVar23 + 1;
            uVar30 = (ulong)((int)uVar30 + 1);
            uVar41 = (ulong)(uint)pbVar27[uVar22].n;
          }
          puVar17 = puVar17 + pbVar27[uVar22].size;
          iVar25 = iVar25 + 1;
        } while (iVar25 != iVar43);
      }
      break;
    default:
      bcf_get_format_values_cold_1();
      uVar15 = iVar25 - 1U >> 1 | iVar25 - 1U;
      uVar15 = uVar15 >> 2 | uVar15;
      uVar15 = uVar15 >> 4 | uVar15;
      uVar15 = uVar15 >> 8 | uVar15;
      uVar15 = (uVar15 >> 0x10 | uVar15) + 1;
      uVar41 = 4;
      if (4 < uVar15) {
        uVar41 = (ulong)uVar15;
      }
      uVar42 = (uint)(long)((double)uVar41 * 0.77 + 0.5);
      if (uVar42 <= puVar31[1]) {
        return 0;
      }
      uVar40 = (uint)uVar41;
      uVar26 = (uint)(uVar41 >> 2) & 0x3ffffffc;
      if (uVar15 < 0x10) {
        uVar26 = 4;
      }
      pvVar16 = malloc((ulong)uVar26);
      if (pvVar16 == (void *)0x0) {
        return -1;
      }
      memset(pvVar16,0xaa,(ulong)uVar26);
      uVar15 = *puVar31;
      if (uVar15 < uVar40) {
        pvVar18 = realloc(*(void **)(puVar31 + 6),uVar41 * 8);
        if (pvVar18 == (void *)0x0) {
LAB_00121784:
          free(pvVar16);
          return -1;
        }
        *(void **)(puVar31 + 6) = pvVar18;
        pvVar18 = realloc(*(void **)(puVar31 + 8),uVar41 * 0x30);
        if (pvVar18 == (void *)0x0) goto LAB_00121784;
        *(void **)(puVar31 + 8) = pvVar18;
        uVar15 = *puVar31;
        if (uVar15 == 0) goto LAB_00121768;
      }
      uVar26 = 0;
      do {
        lVar38 = *(long *)(puVar31 + 4);
        uVar37 = *(uint *)(lVar38 + (ulong)(uVar26 >> 4) * 4);
        uVar21 = uVar26 * 2 & 0x1e;
        if ((uVar37 >> (sbyte)uVar21 & 3) == 0) {
          pcVar32 = *(char **)(*(long *)(puVar31 + 6) + (ulong)uVar26 * 8);
          lVar33 = *(long *)(puVar31 + 8);
          lVar39 = (ulong)uVar26 * 0x30;
          uStack_e0 = *(undefined8 *)(lVar33 + lVar39);
          uStack_d8 = ((undefined8 *)(lVar33 + lVar39))[1];
          puVar2 = (undefined8 *)(lVar33 + 0x10 + lVar39);
          uStack_d0 = *puVar2;
          uStack_c8 = puVar2[1];
          puVar2 = (undefined8 *)(lVar33 + 0x20 + lVar39);
          uStack_c0 = *puVar2;
          uStack_b8 = puVar2[1];
          *(uint *)(lVar38 + (ulong)(uVar26 >> 4) * 4) = uVar37 | 1 << uVar21;
          while( true ) {
            uVar15 = (uint)*pcVar32;
            if (*pcVar32 == '\0') {
              uVar15 = 0;
            }
            else {
              cVar19 = pcVar32[1];
              if (cVar19 != '\0') {
                pcVar35 = pcVar32 + 2;
                do {
                  uVar15 = (int)cVar19 + uVar15 * 0x1f;
                  cVar19 = *pcVar35;
                  pcVar35 = pcVar35 + 1;
                } while (cVar19 != '\0');
              }
            }
            uVar15 = uVar15 & uVar40 - 1;
            uVar22 = (ulong)(uVar15 >> 4);
            uVar37 = *(uint *)((long)pvVar16 + uVar22 * 4);
            bVar20 = (char)uVar15 * '\x02' & 0x1e;
            uVar21 = 2 << bVar20;
            if ((uVar21 & uVar37) == 0) {
              iVar43 = 1;
              do {
                uVar15 = uVar15 + iVar43 & uVar40 - 1;
                bVar20 = (char)uVar15 * '\x02' & 0x1e;
                uVar21 = 2 << bVar20;
                uVar22 = (ulong)(uVar15 >> 4);
                uVar37 = *(uint *)((long)pvVar16 + uVar22 * 4);
                iVar43 = iVar43 + 1;
              } while ((uVar21 & uVar37) == 0);
            }
            *(uint *)((long)pvVar16 + uVar22 * 4) = ~uVar21 & uVar37;
            uVar30 = (ulong)uVar15;
            if (*puVar31 <= uVar15) break;
            lVar33 = *(long *)(puVar31 + 6);
            if ((*(uint *)(lVar38 + uVar22 * 4) >> bVar20 & 3) != 0) goto LAB_001216fc;
            pcVar35 = *(char **)(lVar33 + uVar30 * 8);
            *(char **)(lVar33 + uVar30 * 8) = pcVar32;
            lVar38 = *(long *)(puVar31 + 8);
            lVar33 = uVar30 * 0x30;
            uVar6 = *(undefined8 *)(lVar38 + lVar33);
            uVar7 = ((undefined8 *)(lVar38 + lVar33))[1];
            puVar2 = (undefined8 *)(lVar38 + 0x10 + lVar33);
            uVar8 = *puVar2;
            uVar9 = puVar2[1];
            puVar2 = (undefined8 *)(lVar38 + 0x20 + lVar33);
            uVar10 = *puVar2;
            uVar11 = puVar2[1];
            puVar2 = (undefined8 *)(lVar38 + 0x20 + lVar33);
            *puVar2 = uStack_c0;
            puVar2[1] = uStack_b8;
            puVar2 = (undefined8 *)(lVar38 + 0x10 + lVar33);
            *puVar2 = uStack_d0;
            puVar2[1] = uStack_c8;
            *(undefined8 *)(lVar38 + lVar33) = uStack_e0;
            ((undefined8 *)(lVar38 + lVar33))[1] = uStack_d8;
            lVar38 = *(long *)(puVar31 + 4);
            puVar1 = (uint *)(lVar38 + uVar22 * 4);
            *puVar1 = *puVar1 | 1 << bVar20;
            pcVar32 = pcVar35;
            uStack_e0 = uVar6;
            uStack_d8 = uVar7;
            uStack_d0 = uVar8;
            uStack_c8 = uVar9;
            uStack_c0 = uVar10;
            uStack_b8 = uVar11;
          }
          lVar33 = *(long *)(puVar31 + 6);
LAB_001216fc:
          *(char **)(lVar33 + uVar30 * 8) = pcVar32;
          lVar38 = *(long *)(puVar31 + 8);
          lVar33 = uVar30 * 0x30;
          puVar2 = (undefined8 *)(lVar38 + 0x20 + lVar33);
          *puVar2 = uStack_c0;
          puVar2[1] = uStack_b8;
          puVar2 = (undefined8 *)(lVar38 + 0x10 + lVar33);
          *puVar2 = uStack_d0;
          puVar2[1] = uStack_c8;
          *(undefined8 *)(lVar38 + lVar33) = uStack_e0;
          ((undefined8 *)(lVar38 + lVar33))[1] = uStack_d8;
          uVar15 = *puVar31;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar15);
      if (uVar40 < uVar15) {
        pvVar18 = realloc(*(void **)(puVar31 + 6),uVar41 * 8);
        *(void **)(puVar31 + 6) = pvVar18;
        pvVar18 = realloc(*(void **)(puVar31 + 8),uVar41 * 0x30);
        *(void **)(puVar31 + 8) = pvVar18;
      }
LAB_00121768:
      free(*(void **)(puVar31 + 4));
      *(void **)(puVar31 + 4) = pvVar16;
      *puVar31 = uVar40;
      puVar31[2] = puVar31[1];
      puVar31[3] = uVar42;
      return 0;
    case 5:
      uVar15 = pbVar27[uVar22].n;
      if (0 < iVar43) {
        puVar17 = pbVar27[uVar22].p;
        puVar24 = (uint32_t *)*dst;
        iVar25 = pbVar27[uVar22].size;
        iVar34 = 0;
        do {
          uVar14 = bcf_float_vector_end;
          if ((int)uVar15 < 1) {
            uVar41 = 0;
LAB_00121397:
            iVar36 = uVar15 - (int)uVar41;
            if (iVar36 != 0 && (int)uVar41 <= (int)uVar15) {
              do {
                *puVar24 = uVar13;
                puVar24 = puVar24 + 1;
                iVar36 = iVar36 + -1;
              } while (iVar36 != 0);
            }
          }
          else {
            lVar38 = 0;
            uVar41 = 0;
            do {
              uVar5 = *(uint32_t *)(puVar17 + uVar41 * 4);
              uVar29 = uVar12;
              if ((uVar12 != uVar5) && (uVar29 = uVar5, uVar14 == uVar5)) {
                puVar24[uVar41] = uVar14;
                puVar24 = (uint32_t *)((long)puVar24 - lVar38);
                goto LAB_00121397;
              }
              puVar24[uVar41] = uVar29;
              uVar41 = uVar41 + 1;
              lVar38 = lVar38 + -4;
            } while (uVar15 != uVar41);
            puVar24 = (uint32_t *)((long)puVar24 - lVar38);
          }
          puVar17 = puVar17 + iVar25;
          iVar34 = iVar34 + 1;
        } while (iVar34 != iVar43);
      }
    }
    sVar28 = (size_t)(uVar15 * iVar43);
  }
LAB_00121446:
  return (int)sVar28;
}

Assistant:

int bcf_get_format_values(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, void **dst, int *ndst, int type)
{
    int i,j, tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,tag_id) ) return -1;    // no such FORMAT field in the header
    if ( tag[0]=='G' && tag[1]=='T' && tag[2]==0 )
    {
        // Ugly: GT field is considered to be a string by the VCF header but BCF represents it as INT.
        if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=BCF_HT_STR ) return -2;
    }
    else if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=type ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==tag_id ) break;
    if ( i==line->n_fmt ) return -3;                               // the tag is not present in this record
    bcf_fmt_t *fmt = &line->d.fmt[i];

    if ( type==BCF_HT_STR )
    {
        int n = fmt->n*bcf_hdr_nsamples(hdr);
        if ( *ndst < n )
        {
            *dst  = realloc(*dst, n);
            if ( !*dst ) return -4;     // could not alloc
            *ndst = n;
        }
        memcpy(*dst,fmt->p,n);
        return n;
    }

    // Make sure the buffer is big enough
    int nsmpl = bcf_hdr_nsamples(hdr);
    int size1 = type==BCF_HT_INT ? sizeof(int32_t) : sizeof(float);
    if ( *ndst < fmt->n*nsmpl )
    {
        *ndst = fmt->n*nsmpl;
        *dst  = realloc(*dst, *ndst*size1);
        if ( !dst ) return -4;     // could not alloc
    }

    #define BRANCH(type_t, is_missing, is_vector_end, set_missing, set_vector_end, out_type_t) { \
        out_type_t *tmp = (out_type_t *) *dst; \
        type_t *p = (type_t*) fmt->p; \
        for (i=0; i<nsmpl; i++) \
        { \
            for (j=0; j<fmt->n; j++) \
            { \
                if ( is_missing ) set_missing; \
                else if ( is_vector_end ) { set_vector_end; break; } \
                else *tmp = p[j]; \
                tmp++; \
            } \
            for (; j<fmt->n; j++) { set_vector_end; tmp++; } \
            p = (type_t *)((char *)p + fmt->size); \
        } \
    }
    switch (fmt->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  p[j]==bcf_int8_missing,  p[j]==bcf_int8_vector_end,  *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_INT16: BRANCH(int16_t, p[j]==bcf_int16_missing, p[j]==bcf_int16_vector_end, *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_INT32: BRANCH(int32_t, p[j]==bcf_int32_missing, p[j]==bcf_int32_vector_end, *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_FLOAT: BRANCH(float,   bcf_float_is_missing(p[j]), bcf_float_is_vector_end(p[j]), bcf_float_set_missing(*tmp), bcf_float_set_vector_end(*tmp), float); break;
        default: fprintf(stderr,"TODO: %s:%d .. fmt->type=%d\n", __FILE__,__LINE__, fmt->type); exit(1);
    }
    #undef BRANCH
    return nsmpl*fmt->n;
}